

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_argsof.cpp
# Opt level: O2

void __thiscall tst_internals_argsof::basicFunction(tst_internals_argsof *this)

{
  return;
}

Assistant:

void tst_internals_argsof::basicFunction()
{
    // Function type.
    Q_STATIC_ASSERT((std::is_same<ArgsOf<decltype(fnNoArg)>::first, void>::value));
    Q_STATIC_ASSERT((std::is_same<ArgsOf<decltype(fnOneArg)>::first, float>::value));
    Q_STATIC_ASSERT((std::is_same<ArgsOf<decltype(fnManyArgs)>::first, const float&>::value));

    // Function pointer type.
    Q_STATIC_ASSERT((std::is_same<ArgsOf<decltype(&fnNoArg)>::first, void>::value));
    Q_STATIC_ASSERT((std::is_same<ArgsOf<decltype(&fnOneArg)>::first, float>::value));
    Q_STATIC_ASSERT((std::is_same<ArgsOf<decltype(&fnManyArgs)>::first, const float&>::value));
}